

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t *psVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  MixingHashState MVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t *psVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar6 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,true,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x10,0x18);
    if ((local_48 != 0) && (!bVar6)) {
      if ((char)local_3f == '\x01') {
        __assert_fail("!was_soo_",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7c2,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
      psVar11 = (size_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
      sVar10 = 0;
      sVar9 = local_48;
      do {
        if ((char)local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7be,
                        "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
        }
        if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar10)) {
          sVar9 = *psVar11;
          MVar7 = hash_internal::MixingHashState::combine_contiguous
                            ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                             (uchar *)psVar11[1],sVar9);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = MVar7.state_ + sVar9;
          uVar13 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
          FVar14 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar13);
          uVar8 = FVar14.offset;
          uVar3 = common->capacity_;
          if (uVar3 <= uVar8) {
            __assert_fail("i < c.capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x70c,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          cVar12 = (ctrl_t)uVar13 & ~kEmpty;
          pcVar4 = (common->heap_or_soo_).heap.control;
          pcVar4[uVar8] = cVar12;
          pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar8 - 0xf & uVar3)] = cVar12;
          *(size_t *)(lVar2 + 0x10 + uVar8 * 0x18) = psVar11[2];
          sVar9 = psVar11[1];
          psVar1 = (size_t *)(lVar2 + uVar8 * 0x18);
          *psVar1 = *psVar11;
          psVar1[1] = sVar9;
          sVar9 = local_48;
        }
        sVar10 = sVar10 + 1;
        psVar11 = psVar11 + 3;
      } while (sVar10 != sVar9);
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x18);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, const google::protobuf::json_internal::ResolverPool::Field *>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::json_internal::ResolverPool::Field *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::json_internal::ResolverPool::Field *>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }